

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void __thiscall
PeleLM::advance_chemistry(PeleLM *this,MultiFab *mf_old,MultiFab *mf_new,Real dt,MultiFab *Force)

{
  Geometry *this_00;
  IntVect *pIVar1;
  Amr *pAVar2;
  __uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true> _Var3;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var4;
  _Head_base<0UL,_amrex::MultiFab_*,_false> _Var5;
  pointer pIVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  ulong uVar8;
  int iVar9;
  Periodicity *pPVar10;
  mapped_type *pmVar11;
  double *pdVar12;
  ostream *poVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  int iVar20;
  long lVar21;
  pointer pcVar22;
  undefined4 uVar23;
  undefined8 unaff_RBP;
  long lVar24;
  int iVar25;
  undefined8 *puVar26;
  BoxArray *pBVar27;
  double *pdVar28;
  double *pdVar29;
  double *pdVar30;
  long lVar31;
  long lVar32;
  int j;
  FabArray<amrex::FArrayBox> *pFVar33;
  int iVar34;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> this_02;
  bool bVar35;
  bool bVar36;
  byte bVar37;
  double dVar38;
  Periodicity PVar39;
  double *local_dc8;
  long local_db0;
  pointer local_d98;
  long local_d90;
  long local_d88;
  DistributionMapping local_d48;
  FabArray<amrex::FArrayBox> *local_d30;
  Real local_d28;
  long local_d20;
  long local_d18;
  undefined1 local_d10 [32];
  int local_cf0;
  int local_cec;
  int local_ce8;
  double local_cd0;
  long local_cc8;
  long local_cc0;
  undefined **local_cb8;
  long local_cb0;
  ulong local_ca8;
  long local_ca0;
  undefined4 local_c94;
  undefined4 local_c90;
  Box local_c8c;
  FabArray<amrex::FArrayBox> *local_c70;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_c68;
  Real time_chem;
  Real dt_incr;
  Array4<double> local_c50;
  double local_c10;
  long local_c08;
  long local_c00;
  double *local_bf8;
  long local_bf0;
  long local_be8;
  pointer local_be0;
  Array4<double> local_bd8;
  key_type local_b98;
  MFIter Smfi;
  Array4<double> local_9e8;
  Array4<double> local_9a8;
  BoxArray ba;
  Array4<double> local_900;
  BoxArray cf_grids;
  BoxArray local_858;
  Array4<int> local_7f0;
  MultiFab fcnCntTemp;
  MultiFab STemp;
  MultiFab diagTemp;
  MultiFab FTemp;
  FabArray<amrex::BaseFab<int>_> react_mask;
  
  bVar37 = 0;
  local_d30 = &Force->super_FabArray<amrex::FArrayBox>;
  local_d28 = dt;
  local_c10 = amrex::ParallelDescriptor::second();
  if (avg_down_chem == true) {
    iVar20 = (this->super_NavierStokesBase).super_AmrLevel.level;
    pAVar2 = (this->super_NavierStokesBase).super_AmrLevel.parent;
    if (iVar20 < *(int *)&(pAVar2->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c) {
      uVar23 = (undefined4)
               CONCAT71((int7)((ulong)unaff_RBP >> 8),
                        *(long *)(*(long *)((long)(pAVar2->amr_level).
                                                  super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                                  .
                                                  super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(long)iVar20 + 1]._M_t.
                                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                           + 0x170) + 0xd0 + (long)RhoYdot_Type * 0xe0) != 0);
      goto LAB_0019c973;
    }
  }
  uVar23 = 0;
LAB_0019c973:
  if (hack_nochem == 0) {
    amrex::BoxArray::BoxArray(&cf_grids);
    if ((char)uVar23 != '\0') {
      _Var4.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
      super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
      super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
           (((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
           super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start
           [(long)(this->super_NavierStokesBase).super_AmrLevel.level + 1]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
      puVar26 = (undefined8 *)
                ((long)_Var4.
                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                       .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0xd8);
      pBVar27 = &cf_grids;
      for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
        *(undefined8 *)&pBVar27->m_bat = *puVar26;
        puVar26 = puVar26 + (ulong)bVar37 * -2 + 1;
        pBVar27 = (BoxArray *)((long)pBVar27 + (ulong)bVar37 * -0x10 + 8);
      }
      cf_grids.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)
            ((long)_Var4.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x120);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&cf_grids.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)_Var4.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x128));
      cf_grids.m_simplified_list.super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = *(element_type **)
                ((long)_Var4.
                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                       .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x130);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&cf_grids.m_simplified_list.
                  super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)_Var4.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x138));
      amrex::BoxArray::coarsen(&cf_grids,&(this->super_NavierStokesBase).super_AmrLevel.fine_ratio);
    }
    _Var5._M_head_impl =
         *(MultiFab **)
          &(this->super_NavierStokesBase).super_AmrLevel.state.
           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
           super__Vector_impl_data._M_start[RhoYdot_Type].new_data._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    iVar20 = ((_Var5._M_head_impl)->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect
             [0];
    iVar34 = (mf_old->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
    iVar9 = (mf_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0];
    if (iVar34 < iVar20) {
      iVar20 = iVar34;
    }
    if (iVar9 < iVar20) {
      iVar20 = iVar9;
    }
    amrex::BoxArray::BoxArray
              (&ba,&(mf_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
    local_d48.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (mf_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap.m_ref.
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_d48.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (mf_new->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap.m_ref.
         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
    if (local_d48.m_ref.
        super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_d48.m_ref.
         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_d48.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_d48.m_ref.
         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi)->_M_use_count =
             (local_d48.m_ref.
              super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    lVar31 = (long)*(int *)(amrex::ParallelContext::frames + 0x10) *
             (long)(anonymous_namespace)::chem_box_chop_threshold;
    lVar15 = ((long)((ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)((ba.m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7;
    local_c90 = uVar23;
    local_c70 = &mf_new->super_FabArray<amrex::FArrayBox>;
    local_c68._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
         (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)_Var5._M_head_impl;
    if (lVar15 < lVar31) {
      bVar36 = lVar31 <= lVar15;
      iVar34 = 1;
      do {
        iVar9 = (this->super_NavierStokesBase).super_AmrLevel.level;
        pIVar6 = (((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore).
                 super_AmrMesh.super_AmrInfo.max_grid_size.
                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar14 = pIVar6[iVar9].vect[0] / iVar34;
        iVar25 = pIVar6[iVar9].vect[1] / iVar34;
        iVar9 = pIVar6[iVar9].vect[2] / iVar34;
        if (0xf < iVar9 && (0xf < iVar25 && 0xf < iVar14)) {
          Smfi.fabArray._0_4_ = iVar9;
          lVar15 = 2;
          Smfi.m_fa._M_t.
          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t
          .super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = iVar14;
          Smfi.m_fa._M_t.
          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t
          .super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = iVar25;
          do {
            if (lVar31 <= ((long)((ba.m_ref.
                                   super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->m_abox).
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                           (long)((ba.m_ref.
                                   super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->m_abox).
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7)
            break;
            Smfi.tile_size.vect[lVar15 + -4] = Smfi.tile_size.vect[lVar15 + -4] / 2;
            amrex::BoxArray::maxSize(&ba,(IntVect *)&Smfi);
            if (lVar31 <= ((long)((ba.m_ref.
                                   super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->m_abox).
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                           (long)((ba.m_ref.
                                   super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->m_abox).
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7) {
              bVar36 = true;
            }
            bVar35 = lVar15 != 0;
            lVar15 = lVar15 + -1;
          } while (bVar35);
        }
      } while ((0xf < iVar9 && (0xf < iVar25 && 0xf < iVar14)) && (iVar34 = iVar34 * 2, !bVar36));
    }
    getFuncCountDM((PeleLM *)&Smfi,(BoxArray *)this,(int)&ba);
    this_01._M_pi =
         local_d48.m_ref.
         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount
         ._M_pi;
    local_d48.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             CONCAT44(Smfi.m_fa._M_t.
                      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                      .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_,
                      (int)Smfi.m_fa._M_t.
                           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                           .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl);
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             CONCAT44(Smfi.fabArray._4_4_,(int)Smfi.fabArray);
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 0;
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
    Smfi.fabArray._0_4_ = 0;
    Smfi.fabArray._4_4_ = 0;
    bVar36 = local_d48.m_ref.
             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_d48.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var7;
    if (bVar36) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(Smfi.fabArray._4_4_,(int)Smfi.fabArray) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(Smfi.fabArray._4_4_,(int)Smfi.fabArray));
    }
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
    Smfi.fabArray._0_4_ = 0;
    Smfi.fabArray._4_4_ = 0;
    Smfi.tile_size.vect[0] = 0;
    Smfi.tile_size.vect[1] = 0;
    Smfi.tile_size.vect[2] = 0;
    Smfi.flags = '\0';
    Smfi._29_3_ = 0;
    Smfi.currentIndex = 0;
    Smfi.beginIndex = 0;
    FTemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
         (_func_int **)&PTR__FabFactory_0074e8d0;
    amrex::MultiFab::MultiFab
              (&STemp,&ba,&local_d48,0xc,0,(MFInfo *)&Smfi,(FabFactory<amrex::FArrayBox> *)&FTemp);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&Smfi.tile_size);
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
    Smfi.fabArray._0_4_ = 0;
    Smfi.fabArray._4_4_ = 0;
    Smfi.tile_size.vect[0] = 0;
    Smfi.tile_size.vect[1] = 0;
    Smfi.tile_size.vect[2] = 0;
    Smfi.flags = '\0';
    Smfi._29_3_ = 0;
    Smfi.currentIndex = 0;
    Smfi.beginIndex = 0;
    fcnCntTemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
         (_func_int **)&PTR__FabFactory_0074e8d0;
    amrex::MultiFab::MultiFab
              (&FTemp,&ba,&local_d48,
               (((FabArray<amrex::FArrayBox> *)&local_d30->super_FabArrayBase)->super_FabArrayBase).
               n_comp,0,(MFInfo *)&Smfi,(FabFactory<amrex::FArrayBox> *)&fcnCntTemp);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&Smfi.tile_size);
    iVar34 = first_spec;
    pPVar10 = amrex::Periodicity::NonPeriodic();
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 0;
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
    Smfi.fabArray._0_4_ = 0;
    fcnCntTemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
         (_func_int **)0x0;
    fcnCntTemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
    amrex::FabArray<amrex::FArrayBox>::ParallelCopy_nowait
              (&STemp.super_FabArray<amrex::FArrayBox>,&mf_old->super_FabArray<amrex::FArrayBox>,
               iVar34,0,0xc,(IntVect *)&Smfi,(IntVect *)&fcnCntTemp,pPVar10,COPY,(CPC *)0x0,false);
    pPVar10 = amrex::Periodicity::NonPeriodic();
    amrex::FabArray<amrex::FArrayBox>::ParallelCopy
              (&FTemp.super_FabArray<amrex::FArrayBox>,local_d30,pPVar10,COPY);
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
    Smfi.fabArray._0_4_ = 0;
    Smfi.fabArray._4_4_ = 0;
    Smfi.tile_size.vect[0] = 0;
    Smfi.tile_size.vect[1] = 0;
    Smfi.tile_size.vect[2] = 0;
    Smfi.flags = '\0';
    Smfi._29_3_ = 0;
    Smfi.currentIndex = 0;
    Smfi.beginIndex = 0;
    diagTemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
         (_func_int **)&PTR__FabFactory_0074e8d0;
    amrex::MultiFab::MultiFab
              (&fcnCntTemp,&ba,&local_d48,1,0,(MFInfo *)&Smfi,
               (FabFactory<amrex::FArrayBox> *)&diagTemp);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&Smfi.tile_size);
    amrex::MultiFab::MultiFab(&diagTemp);
    amrex::FabArray<amrex::BaseFab<int>_>::FabArray(&react_mask);
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
    Smfi.fabArray._0_4_ = 0;
    Smfi.fabArray._4_4_ = 0;
    Smfi.tile_size.vect[0] = 0;
    Smfi.tile_size.vect[1] = 0;
    Smfi.tile_size.vect[2] = 0;
    Smfi.flags = '\0';
    Smfi._29_3_ = 0;
    Smfi.currentIndex = 0;
    Smfi.beginIndex = 0;
    local_d10._0_8_ = &PTR__FabFactory_0074ebe8;
    local_858.m_bat._0_8_ = 0;
    local_858.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)0;
    (*react_mask.super_FabArrayBase._vptr_FabArrayBase[3])
              (&react_mask,&ba,&local_d48,1,&local_858,&Smfi,local_d10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&Smfi.tile_size);
    pPVar10 = amrex::Periodicity::NonPeriodic();
    amrex::FabArray<amrex::BaseFab<int>_>::ParallelCopy
              (&react_mask,&(this->super_NavierStokesBase).ebmask,pPVar10,COPY);
    bVar36 = plot_reactions;
    if (plot_reactions == true) {
      local_b98._M_dataplus._M_p = (pointer)&local_b98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b98,"REACTIONS","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                ::operator[](&this->auxDiag,&local_b98);
      amrex::intersect(&local_858,&ba,
                       &(((pmVar11->_M_t).
                          super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                          .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                        super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray);
      uVar23 = CONCAT31((int3)((uint)iVar34 >> 8),
                        *(long *)((long)local_858.m_ref.
                                        super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 8) !=
                        *(long *)local_858.m_ref.
                                 super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       );
    }
    else {
      uVar23 = 0;
    }
    if ((bVar36 != false) &&
       (amrex::BoxArray::~BoxArray(&local_858),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_b98._M_dataplus._M_p != &local_b98.field_2)) {
      operator_delete(local_b98._M_dataplus._M_p,local_b98.field_2._M_allocated_capacity + 1);
    }
    if ((char)uVar23 != '\0') {
      local_d10._0_8_ = local_d10 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d10,"REACTIONS","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                ::operator[](&this->auxDiag,(key_type *)local_d10);
      Smfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
      Smfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
      Smfi.fabArray._0_4_ = 0;
      Smfi.fabArray._4_4_ = 0;
      Smfi.tile_size.vect[0] = 0;
      Smfi.tile_size.vect[1] = 0;
      Smfi.tile_size.vect[2] = 0;
      Smfi.flags = '\0';
      Smfi._29_3_ = 0;
      Smfi.currentIndex = 0;
      Smfi.beginIndex = 0;
      local_c50.p = (double *)&PTR__FabFactory_0074e8d0;
      amrex::MultiFab::define
                (&diagTemp,&ba,&local_d48,
                 (((pmVar11->_M_t).
                   super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                 super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,0,(MFInfo *)&Smfi,
                 (FabFactory<amrex::FArrayBox> *)&local_c50);
      pIVar1 = &Smfi.tile_size;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)pIVar1);
      if ((undefined1 *)local_d10._0_8_ != local_d10 + 0x10) {
        operator_delete((void *)local_d10._0_8_,local_d10._16_8_ + 1);
      }
      Smfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
              )pIVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&Smfi,"REACTIONS","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                ::operator[](&this->auxDiag,(key_type *)&Smfi);
      pFVar33 = &((pmVar11->_M_t).
                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                 super_FabArray<amrex::FArrayBox>;
      pPVar10 = amrex::Periodicity::NonPeriodic();
      amrex::FabArray<amrex::FArrayBox>::ParallelCopy
                (&diagTemp.super_FabArray<amrex::FArrayBox>,pFVar33,pPVar10,COPY);
      if (Smfi.m_fa._M_t.
          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t
          .super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl !=
          (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
           )pIVar1) {
        operator_delete((void *)Smfi.m_fa._M_t.
                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl,
                        Smfi.tile_size.vect._0_8_ + 1);
      }
    }
    if (2 < NavierStokesBase::verbose) {
      poVar13 = amrex::OutStream();
      Smfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ =
           *(undefined4 *)(DAT_00756620 + -0x30);
      pIVar1 = &Smfi.tile_size;
      Smfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
           *(undefined4 *)(DAT_00756620 + -0x48);
      Smfi.fabArray._0_4_ = (int)poVar13;
      Smfi.fabArray._4_4_ = (undefined4)((ulong)poVar13 >> 0x20);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
      *(undefined8 *)((long)Smfi.tile_size.vect + *(long *)(Smfi.tile_size.vect._0_8_ + -0x18) + 8)
           = *(undefined8 *)
              ((long)CONCAT44(Smfi.fabArray._4_4_,(int)Smfi.fabArray) +
              *(long *)(*(long *)CONCAT44(Smfi.fabArray._4_4_,(int)Smfi.fabArray) + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pIVar1,"      PeleLM::advance_chemistry() FABs in tmp MF: ",0x32);
      std::ostream::operator<<
                (pIVar1,(int)((ulong)((long)((STemp.super_FabArray<amrex::FArrayBox>.
                                              super_FabArrayBase.boxarray.m_ref.
                                              super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr)->m_abox).
                                            super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)((STemp.super_FabArray<amrex::FArrayBox>.
                                             super_FabArrayBase.boxarray.m_ref.
                                             super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->m_abox).
                                           super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                        -0x49249249);
      local_d10[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pIVar1,local_d10,1);
      amrex::Print::~Print((Print *)&Smfi);
    }
    local_c94 = uVar23;
    amrex::MFIter::MFIter(&Smfi,(FabArrayBase *)&STemp,true);
    if (Smfi.currentIndex < Smfi.endIndex) {
      do {
        amrex::MFIter::tilebox(&local_c8c,&Smfi);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)local_d10,&STemp.super_FabArray<amrex::FArrayBox>,&Smfi);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_c50,&STemp.super_FabArray<amrex::FArrayBox>,&Smfi,9);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_9a8,&STemp.super_FabArray<amrex::FArrayBox>,&Smfi,10);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_9e8,&fcnCntTemp.super_FabArray<amrex::FArrayBox>,&Smfi);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_bd8,&FTemp.super_FabArray<amrex::FArrayBox>,&Smfi);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_900,&FTemp.super_FabArray<amrex::FArrayBox>,&Smfi,9);
        amrex::FabArray<amrex::BaseFab<int>_>::array<amrex::BaseFab<int>,_0>
                  (&local_7f0,&react_mask,&Smfi);
        local_ca0 = CONCAT44(local_ca0._4_4_,local_c8c.bigend.vect[2]);
        if (local_c8c.smallend.vect[2] <= local_c8c.bigend.vect[2]) {
          local_cb8 = (undefined **)local_c50.p;
          local_cc0 = local_c50.kstride;
          local_d18 = (long)local_c8c.smallend.vect[1];
          lVar15 = (long)local_c8c.smallend.vect[0];
          local_cd0 = (double)((local_d18 - local_bd8.begin.y) *
                               CONCAT44(local_bd8.jstride._4_4_,(int)local_bd8.jstride) * 8 +
                               lVar15 * 8 + (long)local_bd8.begin.x * -8 +
                              CONCAT44(local_bd8.p._4_4_,(int)local_bd8.p));
          local_cc8 = CONCAT44(local_bd8.kstride._4_4_,(int)local_bd8.kstride) * 8;
          local_be8 = -(long)local_bd8.begin.z;
          local_be0 = (pointer)(local_d10._0_8_ +
                               (local_d18 - local_cec) *
                               CONCAT44(local_d10._12_4_,local_d10._8_4_) * 8 + lVar15 * 8 +
                               (long)local_cf0 * -8);
          local_d20 = local_d10._16_8_ * 8;
          local_cb0 = -(long)local_ce8;
          local_bf0 = (long)local_c50.begin.z;
          local_bf8 = local_900.p;
          local_c00 = local_900.kstride;
          local_c08 = (long)local_900.begin.z;
          local_ca8 = (ulong)(uint)local_c8c.bigend.vect[1];
          iVar34 = local_c8c.smallend.vect[2];
          do {
            if (local_c8c.smallend.vect[1] <= local_c8c.bigend.vect[1]) {
              lVar31 = (long)iVar34;
              local_dc8 = (double *)((local_be8 + lVar31) * local_cc8 + (long)local_cd0);
              pdVar29 = (double *)(local_be0 + (local_cb0 + lVar31) * local_d20);
              lVar21 = (lVar31 - local_bf0) * local_c50.kstride;
              lVar16 = (lVar31 - local_c08) * local_900.kstride;
              lVar31 = local_d18;
              do {
                if (local_c8c.smallend.vect[0] <= local_c8c.bigend.vect[0]) {
                  lVar17 = (lVar31 - local_c50.begin.y) * local_c50.jstride;
                  lVar18 = (lVar31 - local_900.begin.y) * local_900.jstride;
                  pdVar12 = local_dc8;
                  lVar32 = lVar15;
                  pdVar28 = pdVar29;
                  do {
                    lVar24 = 9;
                    pdVar19 = pdVar12;
                    pdVar30 = pdVar28;
                    do {
                      *pdVar30 = *pdVar30 * 0.001;
                      *pdVar19 = *pdVar19 * 0.001;
                      pdVar19 = pdVar19 + local_bd8.nstride;
                      pdVar30 = pdVar30 + local_d10._24_8_;
                      lVar24 = lVar24 + -1;
                    } while (lVar24 != 0);
                    local_c50.p[lVar21 + lVar17 + (lVar32 - local_c50.begin.x)] =
                         (double)((double)local_c50.p
                                          [lVar21 + lVar17 + (lVar32 - local_c50.begin.x)] * 10.0);
                    local_900.p[lVar16 + lVar18 + (lVar32 - local_900.begin.x)] =
                         local_900.p[lVar16 + lVar18 + (lVar32 - local_900.begin.x)] * 10.0;
                    lVar32 = lVar32 + 1;
                    pdVar12 = pdVar12 + 1;
                    pdVar28 = pdVar28 + 1;
                  } while (local_c8c.bigend.vect[0] + 1 != (int)lVar32);
                }
                lVar31 = lVar31 + 1;
                local_dc8 = local_dc8 + CONCAT44(local_bd8.jstride._4_4_,(int)local_bd8.jstride);
                pdVar29 = pdVar29 + CONCAT44(local_d10._12_4_,local_d10._8_4_);
              } while (local_c8c.bigend.vect[1] + 1U != (int)lVar31);
            }
            bVar36 = iVar34 != local_c8c.bigend.vect[2];
            iVar34 = iVar34 + 1;
          } while (bVar36);
        }
        dt_incr = local_d28;
        time_chem = 0.0;
        (**(code **)(*(long *)m_reactor._M_t.
                              super___uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_pele::physics::reactions::ReactorBase_*,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                              .super__Head_base<0UL,_pele::physics::reactions::ReactorBase_*,_false>
                              ._M_head_impl + 0x28))
                  (m_reactor._M_t.
                   super___uniq_ptr_impl<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_pele::physics::reactions::ReactorBase_*,_std::default_delete<pele::physics::reactions::ReactorBase>_>
                   .super__Head_base<0UL,_pele::physics::reactions::ReactorBase_*,_false>.
                   _M_head_impl,&local_c8c,local_d10,&local_bd8,&local_9a8,&local_c50,&local_900,
                   &local_9e8,&local_7f0,&dt_incr,&time_chem);
        dt_incr = local_d28;
        time_chem = 0.0;
        if (local_c8c.smallend.vect[2] <= local_c8c.bigend.vect[2]) {
          iVar34 = local_c8c.smallend.vect[2];
          do {
            if (local_c8c.smallend.vect[1] <= local_c8c.bigend.vect[1]) {
              pdVar29 = (double *)
                        (local_d10._0_8_ +
                        ((long)iVar34 - (long)local_ce8) * local_d10._16_8_ * 8 +
                        ((long)local_c8c.smallend.vect[1] - (long)local_cec) *
                        CONCAT44(local_d10._12_4_,local_d10._8_4_) * 8 +
                        (long)local_c8c.smallend.vect[0] * 8 + (long)local_cf0 * -8);
              lVar31 = ((long)iVar34 - (long)local_c50.begin.z) * local_c50.kstride;
              lVar15 = (long)local_c8c.smallend.vect[1];
              do {
                if (local_c8c.smallend.vect[0] <= local_c8c.bigend.vect[0]) {
                  lVar21 = (lVar15 - local_c50.begin.y) * local_c50.jstride;
                  pdVar12 = pdVar29;
                  lVar16 = (long)local_c8c.smallend.vect[0];
                  do {
                    lVar32 = 9;
                    pdVar28 = pdVar12;
                    do {
                      *pdVar28 = *pdVar28 * 1000.0;
                      pdVar28 = pdVar28 + local_d10._24_8_;
                      lVar32 = lVar32 + -1;
                    } while (lVar32 != 0);
                    local_c50.p[lVar31 + lVar21 + (lVar16 - local_c50.begin.x)] =
                         (double)((double)local_c50.p
                                          [lVar31 + lVar21 + (lVar16 - local_c50.begin.x)] * 0.1);
                    lVar16 = lVar16 + 1;
                    pdVar12 = pdVar12 + 1;
                  } while (local_c8c.bigend.vect[0] + 1 != (int)lVar16);
                }
                lVar15 = lVar15 + 1;
                pdVar29 = pdVar29 + CONCAT44(local_d10._12_4_,local_d10._8_4_);
              } while (local_c8c.bigend.vect[1] + 1U != (int)lVar15);
            }
            bVar36 = iVar34 != local_c8c.bigend.vect[2];
            iVar34 = iVar34 + 1;
          } while (bVar36);
        }
        amrex::MFIter::operator++(&Smfi);
      } while (Smfi.currentIndex < Smfi.endIndex);
    }
    amrex::MFIter::~MFIter(&Smfi);
    amrex::FabArray<amrex::FArrayBox>::clear(&FTemp.super_FabArray<amrex::FArrayBox>);
    this_02._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
         (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)local_c68;
    pFVar33 = local_c70;
    iVar34 = first_spec;
    pPVar10 = amrex::Periodicity::NonPeriodic();
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 0;
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
    Smfi.fabArray._0_4_ = 0;
    local_d10._0_8_ = (pointer)0x0;
    local_d10._8_4_ = 0;
    amrex::FabArray<amrex::FArrayBox>::ParallelCopy_nowait
              (pFVar33,&STemp.super_FabArray<amrex::FArrayBox>,0,iVar34,0xc,(IntVect *)&Smfi,
               (IntVect *)local_d10,pPVar10,COPY,(CPC *)0x0,false);
    amrex::FabArray<amrex::FArrayBox>::clear(&STemp.super_FabArray<amrex::FArrayBox>);
    amrex::MFIter::MFIter(&Smfi,(FabArrayBase *)mf_old,true);
    if (Smfi.currentIndex < Smfi.endIndex) {
      local_cd0 = 1.0 / local_d28;
      do {
        amrex::MFIter::tilebox((Box *)&local_bd8,&Smfi);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)local_d10,&mf_old->super_FabArray<amrex::FArrayBox>,&Smfi
                   ,first_spec);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&local_c50,pFVar33,&Smfi,first_spec);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&local_9a8,local_d30,&Smfi);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_9e8,
                   (FabArray<amrex::FArrayBox> *)
                   this_02._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&Smfi);
        lVar16 = (long)local_bd8.p._4_4_;
        lVar31 = (long)(int)local_bd8.p;
        lVar15 = CONCAT44(local_d10._12_4_,local_d10._8_4_) * 8;
        local_db0 = (lVar16 - local_9e8.begin.y) * local_9e8.jstride * 8 + lVar31 * 8 +
                    (long)local_9e8.begin.x * -8 + (long)local_9e8.p;
        local_cb0 = local_9e8.nstride * 8;
        local_d88 = (lVar16 - local_9a8.begin.y) * local_9a8.jstride * 8 + lVar31 * 8 +
                    (long)local_9a8.begin.x * -8 + (long)local_9a8.p;
        local_cb8 = (undefined **)(local_9a8.nstride * 8);
        local_d90 = (lVar16 - local_c50.begin.y) * local_c50.jstride * 8 + lVar31 * 8 +
                    (long)local_c50.begin.x * -8 + (long)local_c50.p;
        local_cc0 = local_c50.nstride * 8;
        local_d98 = (pointer)(local_d10._0_8_ +
                             (lVar16 - local_cec) * lVar15 + lVar31 * 8 + (long)local_cf0 * -8);
        local_cc8 = local_d10._24_8_ * 8;
        local_d18 = local_d10._16_8_ * 8;
        local_ca0 = -(long)local_ce8;
        local_d20 = CONCAT44(local_d20._4_4_,(int)local_bd8.jstride);
        uVar8 = 0;
        do {
          local_ca8 = uVar8;
          iVar34 = (int)local_bd8.jstride;
          if ((int)local_bd8.jstride <= local_bd8.kstride._4_4_) {
            do {
              if (local_bd8.p._4_4_ <= (int)local_bd8.kstride) {
                lVar31 = (long)iVar34;
                lVar17 = (lVar31 - local_9e8.begin.z) * local_9e8.kstride * 8 + local_db0;
                lVar21 = (lVar31 - local_9a8.begin.z) * local_9a8.kstride * 8 + local_d88;
                lVar32 = (lVar31 - local_c50.begin.z) * local_c50.kstride * 8 + local_d90;
                pcVar22 = local_d98 + (lVar31 + local_ca0) * local_d18;
                lVar31 = lVar16;
                do {
                  if ((int)local_bd8.p <= local_bd8.jstride._4_4_) {
                    lVar18 = 0;
                    do {
                      *(double *)(lVar17 + lVar18 * 8) =
                           -(*(double *)(pcVar22 + lVar18 * 8) - *(double *)(lVar32 + lVar18 * 8)) *
                           local_cd0 - *(double *)(lVar21 + lVar18 * 8);
                      lVar18 = lVar18 + 1;
                    } while ((local_bd8.jstride._4_4_ - (int)local_bd8.p) + 1 != (int)lVar18);
                  }
                  lVar31 = lVar31 + 1;
                  lVar17 = lVar17 + local_9e8.jstride * 8;
                  lVar21 = lVar21 + local_9a8.jstride * 8;
                  lVar32 = lVar32 + local_c50.jstride * 8;
                  pcVar22 = pcVar22 + lVar15;
                } while ((int)local_bd8.kstride + 1 != (int)lVar31);
              }
              bVar36 = iVar34 != local_bd8.kstride._4_4_;
              iVar34 = iVar34 + 1;
            } while (bVar36);
          }
          local_db0 = local_db0 + local_cb0;
          local_d88 = local_d88 + (long)local_cb8;
          local_d90 = local_d90 + local_cc0;
          local_d98 = local_d98 + local_cc8;
          uVar8 = local_ca8 + 1;
        } while (local_ca8 + 1 != 9);
        amrex::MFIter::operator++(&Smfi);
        pFVar33 = local_c70;
        this_02._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
             (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)
             (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)local_c68;
      } while (Smfi.currentIndex < Smfi.endIndex);
    }
    amrex::MFIter::~MFIter(&Smfi);
    if ((char)local_c94 != '\0') {
      Smfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
              )&Smfi.tile_size;
      std::__cxx11::string::_M_construct<char_const*>((string *)&Smfi,"REACTIONS","");
      pmVar11 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>
                ::operator[](&this->auxDiag,(key_type *)&Smfi);
      pFVar33 = &((pmVar11->_M_t).
                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                 super_FabArray<amrex::FArrayBox>;
      pPVar10 = amrex::Periodicity::NonPeriodic();
      amrex::FabArray<amrex::FArrayBox>::ParallelCopy
                (pFVar33,&diagTemp.super_FabArray<amrex::FArrayBox>,pPVar10,COPY);
      if (Smfi.m_fa._M_t.
          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t
          .super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
          super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl !=
          (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
           )&Smfi.tile_size) {
        operator_delete((void *)Smfi.m_fa._M_t.
                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl,
                        Smfi.tile_size.vect._0_8_ + 1);
      }
      amrex::FabArray<amrex::FArrayBox>::clear(&diagTemp.super_FabArray<amrex::FArrayBox>);
    }
    _Var3.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->super_NavierStokesBase).super_AmrLevel.state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start[FuncCount_Type].new_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    iVar34 = ((IntVect *)
             ((long)_Var3.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0))->vect[0];
    if (iVar20 <= iVar34) {
      iVar34 = iVar20;
    }
    pPVar10 = amrex::Periodicity::NonPeriodic();
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 0;
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
    Smfi.fabArray._0_4_ = 0;
    local_d10._4_4_ = iVar34;
    local_d10._0_4_ = iVar34;
    local_d10._8_4_ = iVar34;
    amrex::FabArray<amrex::FArrayBox>::ParallelCopy_nowait
              ((FabArray<amrex::FArrayBox> *)
               _Var3.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
               .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
               &fcnCntTemp.super_FabArray<amrex::FArrayBox>,0,0,1,(IntVect *)&Smfi,
               (IntVect *)local_d10,pPVar10,COPY,(CPC *)0x0,false);
    amrex::FabArray<amrex::FArrayBox>::clear(&fcnCntTemp.super_FabArray<amrex::FArrayBox>);
    if ((char)local_c90 != '\0') {
      NavierStokesBase::average_down
                (&this->super_NavierStokesBase,
                 *(MultiFab **)
                  (*(long *)((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->
                                   amr_level).
                                   super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                   .
                                   super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [(long)(this->super_NavierStokesBase).super_AmrLevel.level + 1].
                                   _M_t.
                                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                            + 0x170) + 0xd0 + (long)RhoYdot_Type * 0xe0),
                 (MultiFab *)
                 this_02._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0,9);
    }
    if (0 < iVar20) {
      this_00 = &(this->super_NavierStokesBase).super_AmrLevel.geom;
      PVar39 = amrex::Geometry::periodicity(this_00);
      Smfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = PVar39.period.vect[0]
      ;
      Smfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = PVar39.period.vect[1]
      ;
      Smfi.fabArray._0_4_ = PVar39.period.vect[2];
      amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
                ((FabArray<amrex::FArrayBox> *)
                 this_02._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0,9,
                 (Periodicity *)&Smfi,false);
      amrex::Extrapolater::FirstOrderExtrap
                ((MultiFab *)
                 this_02._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,this_00,0,9,
                 (((FabArray<amrex::FArrayBox> *)
                  this_02._M_t.
                  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->super_FabArrayBase)
                 .n_grow.vect[0]);
    }
    amrex::FabArray<amrex::BaseFab<int>_>::~FabArray(&react_mask);
    amrex::MultiFab::~MultiFab(&diagTemp);
    amrex::MultiFab::~MultiFab(&fcnCntTemp);
    amrex::MultiFab::~MultiFab(&FTemp);
    amrex::MultiFab::~MultiFab(&STemp);
    if (local_d48.m_ref.
        super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d48.m_ref.
                 super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    amrex::BoxArray::~BoxArray(&ba);
    amrex::BoxArray::~BoxArray(&cf_grids);
  }
  else {
    amrex::MultiFab::Copy(mf_new,mf_old,first_spec,first_spec,0xb,0);
    amrex::MultiFab::Saxpy(mf_new,local_d28,(MultiFab *)local_d30,0,first_spec,10,0);
    _Var3.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->super_NavierStokesBase).super_AmrLevel.state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start[RhoYdot_Type].new_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               _Var3.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
               .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,
               *(int *)((long)_Var3.
                              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                              .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xcc),
               (IntVect *)
               ((long)_Var3.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
    _Var3.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
         (this->super_NavierStokesBase).super_AmrLevel.state.
         super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
         super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
         super__Vector_impl_data._M_start[FuncCount_Type].new_data._M_t.
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               _Var3.super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
               _M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
               .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,0.0,0,
               *(int *)((long)_Var3.
                              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                              .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xcc),
               (IntVect *)
               ((long)_Var3.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl + 0xc0));
  }
  if (2 < NavierStokesBase::verbose) {
    dVar38 = amrex::ParallelDescriptor::second();
    poVar13 = amrex::OutStream();
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ =
         *(undefined4 *)(DAT_00756620 + -0x30);
    pIVar1 = &Smfi.tile_size;
    Smfi.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ =
         *(undefined4 *)(DAT_00756620 + -0x48);
    Smfi.fabArray._0_4_ = (int)poVar13;
    Smfi.fabArray._4_4_ = (undefined4)((ulong)poVar13 >> 0x20);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pIVar1);
    *(undefined8 *)((long)Smfi.tile_size.vect + *(long *)(Smfi.tile_size.vect._0_8_ + -0x18) + 8) =
         *(undefined8 *)
          ((long)CONCAT44(Smfi.fabArray._4_4_,(int)Smfi.fabArray) +
          *(long *)(*(long *)CONCAT44(Smfi.fabArray._4_4_,(int)Smfi.fabArray) + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pIVar1,"      PeleLM::advance_chemistry(): lev: ",0x28);
    std::ostream::operator<<(pIVar1,(this->super_NavierStokesBase).super_AmrLevel.level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pIVar1,", time: [",9);
    dVar38 = dVar38 - local_c10;
    std::ostream::_M_insert<double>(dVar38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pIVar1," ... ",5);
    std::ostream::_M_insert<double>(dVar38);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pIVar1,"]\n",2);
    amrex::Print::~Print((Print *)&Smfi);
  }
  return;
}

Assistant:

void
PeleLM::advance_chemistry (MultiFab&       mf_old,
                           MultiFab&       mf_new,
                           Real            dt,
                           const MultiFab& Force)
{
  BL_PROFILE("PLM::advance_chemistry()");

  const Real strt_time = ParallelDescriptor::second();

  const bool do_avg_down_chem = avg_down_chem
    && level < parent->finestLevel()
    && getLevel(level+1).state[RhoYdot_Type].hasOldData();

  if (hack_nochem)
  {
    MultiFab::Copy(mf_new,mf_old,first_spec,first_spec,NUM_SPECIES+2,0);
    MultiFab::Saxpy(mf_new,dt,Force,0,first_spec,NUM_SPECIES+1,0);
    get_new_data(RhoYdot_Type).setVal(0);
    get_new_data(FuncCount_Type).setVal(0);
  }
  else
  {
    BoxArray cf_grids;

    if (do_avg_down_chem)
    {
      cf_grids = getLevel(level+1).boxArray(); cf_grids.coarsen(fine_ratio);
    }

    MultiFab&  React_new = get_new_data(RhoYdot_Type);
    const int  ngrow     = std::min(std::min(React_new.nGrow(),mf_old.nGrow()),mf_new.nGrow());

    BoxArray  ba           = mf_new.boxArray();
    DistributionMapping dm = mf_new.DistributionMap();
#ifndef AMREX_USE_GPU
    //
    // Chop the grids to level out the chemistry work when on the CPU.
    // We want enough grids so that KNAPSACK works well,
    // but not too many to make unweildy BoxArrays.
    //
    const int Threshold = chem_box_chop_threshold * ParallelDescriptor::NProcs();
    bool      done      = (ba.size() >= Threshold);

    for (int cnt = 1; !done; cnt *= 2)
    {
      const IntVect ChunkSize = parent->maxGridSize(level)/cnt;

      if ( AMREX_D_TERM(ChunkSize[0] < 16, || ChunkSize[1] < 16, || ChunkSize[2] < 16) )
        //
        // Don't let grids get too small.
        //
        break;

      IntVect chunk(ChunkSize);

      for (int j = AMREX_SPACEDIM-1; j >=0 && ba.size() < Threshold; j--)
      {
        chunk[j] /= 2;
        ba.maxSize(chunk);
        if (ba.size() >= Threshold) done = true;
      }
    }

    dm = getFuncCountDM(ba,ngrow);
#endif

    MultiFab STemp(ba, dm, NUM_SPECIES+3, 0);
    MultiFab FTemp(ba, dm, Force.nComp(), 0);

    STemp.ParallelCopy(mf_old,first_spec,0,NUM_SPECIES+3); // Parallel copy.
    FTemp.ParallelCopy(Force);                          // Parallel copy.

    MultiFab fcnCntTemp(ba, dm, 1, 0);
    MultiFab diagTemp;

    // Setup a mask for chemistry. Right used only for EB.
    // TODO: find a way to set that up properly when running boxes on GPU.
    amrex::FabArray<amrex::BaseFab<int>>  react_mask;
    react_mask.define(ba, dm,  1, 0);
#ifdef AMREX_USE_EB
    react_mask.ParallelCopy(ebmask);
#else
    react_mask.setVal(1);
#endif

    const bool do_diag = plot_reactions && amrex::intersect(ba,auxDiag["REACTIONS"]->boxArray()).size() != 0;

    if (do_diag)
    {
        diagTemp.define(ba, dm, auxDiag["REACTIONS"]->nComp(), 0);
        diagTemp.ParallelCopy(*auxDiag["REACTIONS"]); // Parallel copy
    }

    if (verbose > 2)
      amrex::Print() << "      PeleLM::advance_chemistry() FABs in tmp MF: " << STemp.size() << '\n';

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter Smfi(STemp,amrex::TilingIfNotGPU()); Smfi.isValid(); ++Smfi)
    {
        const Box& bx       = Smfi.tilebox();
        auto const& rhoY     = STemp.array(Smfi);
        auto const& rhoH     = STemp.array(Smfi,NUM_SPECIES);
        auto const& temp     = STemp.array(Smfi,NUM_SPECIES+1);
        auto const& fcl      = fcnCntTemp.array(Smfi);
        auto const& frc_rhoY = FTemp.array(Smfi);
        auto const& frc_rhoH = FTemp.array(Smfi, NUM_SPECIES);
        auto const& mask     = react_mask.array(Smfi);

        // Convert MKS -> CGS
        ParallelFor(bx, [rhoY,rhoH, frc_rhoY, frc_rhoH]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
           for (int n = 0; n < NUM_SPECIES; n++) {
              rhoY(i,j,k,n) *= 1.0e-3;
              frc_rhoY(i,j,k,n) *= 1.0e-3;
           }
           rhoH(i,j,k) *= 10.0;
           frc_rhoH(i,j,k) *= 10.0;
        });

        BL_PROFILE_VAR("React()", ReactInLoop);
        Real dt_incr     = dt;
        Real time_chem   = 0;
        /* Solve */
        m_reactor->react(bx, rhoY, frc_rhoY, temp,
                         rhoH, frc_rhoH, fcl,
                         mask, dt_incr, time_chem
#ifdef AMREX_USE_GPU
                         , amrex::Gpu::gpuStream()
#endif
                         );
        dt_incr   = dt;
        time_chem = 0;
        BL_PROFILE_VAR_STOP(ReactInLoop);

        // Convert CGS -> MKS
        ParallelFor(bx, [rhoY,rhoH]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
           for (int n = 0; n < NUM_SPECIES; n++) {
              rhoY(i,j,k,n) *= 1.0e3;
           }
           rhoH(i,j,k) *= 0.1;
        });

#ifdef AMREX_USE_GPU
        Gpu::Device::streamSynchronize();
#endif
    }

    FTemp.clear();

    mf_new.ParallelCopy(STemp,0,first_spec,NUM_SPECIES+3); // Parallel copy.

    STemp.clear();

    //
    // Set React_new (I_R).
    //
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf_old,amrex::TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx         = mfi.tilebox();
        auto const& rhoY_o    = mf_old.const_array(mfi,first_spec);
        auto const& rhoY_n    = mf_new.const_array(mfi,first_spec);
        auto const& frc_rhoY  = Force.const_array(mfi);
        auto const& rhoYdot   = React_new.array(mfi);
        Real dt_inv = 1.0/dt;
        ParallelFor(bx, NUM_SPECIES, [rhoY_o, rhoY_n, frc_rhoY, rhoYdot, dt_inv]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
           rhoYdot(i,j,k,n) = - ( rhoY_o(i,j,k,n) - rhoY_n(i,j,k,n) ) * dt_inv - frc_rhoY(i,j,k,n);
        });
    }

    if (do_diag)
    {
      auxDiag["REACTIONS"]->ParallelCopy(diagTemp); // Parallel copy
      diagTemp.clear();
    }

    MultiFab& FC = get_new_data(FuncCount_Type);
    FC.ParallelCopy(fcnCntTemp,0,0,1,0,std::min(ngrow,FC.nGrow()));
    fcnCntTemp.clear();
    //
    // Approximate covered crse chemistry (I_R) with averaged down fine I_R from previous time step.
    //
    if (do_avg_down_chem)
    {
      MultiFab& fine_React = getLevel(level+1).get_old_data(RhoYdot_Type);
      average_down(fine_React, React_new, 0, NUM_SPECIES);
    }
    //
    // Ensure consistent grow cells.
    //
    if (ngrow > 0)
    {
      React_new.FillBoundary(0,NUM_SPECIES, geom.periodicity());
      Extrapolater::FirstOrderExtrap(React_new, geom, 0, NUM_SPECIES, React_new.nGrow());
    }
  }

  if (verbose > 2)
  {
    const int IOProc = ParallelDescriptor::IOProcessorNumber();

    Real mx = ParallelDescriptor::second() - strt_time, mn = mx;

    ParallelDescriptor::ReduceRealMin(mn,IOProc);
    ParallelDescriptor::ReduceRealMax(mx,IOProc);

    amrex::Print() << "      PeleLM::advance_chemistry(): lev: " << level << ", time: ["
                   << mn << " ... " << mx << "]\n";
  }
}